

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

pair<bool,_Point> intersection(Segment *segment,Plane *plane)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pair<bool,_Point> pVar3;
  float fVar4;
  float fVar5;
  Point PVar6;
  uint local_28;
  undefined8 uStack_24;
  
  PVar6 = operator-(segment->b,&segment->a);
  fVar5 = (plane->normal).z * PVar6.z + (plane->normal).x * PVar6.x + (plane->normal).y * PVar6.y;
  fVar4 = 0.0;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    fVar4 = dotProduct(&segment->a,&plane->normal);
    fVar5 = -(fVar4 + plane->d) / fVar5;
    if ((fVar5 < 0.0) || (ABS(fVar5) < 1.1920929e-07)) {
      local_28 = (uint)local_28._1_3_ << 8;
      uStack_24 = 0;
      fVar4 = 0.0;
    }
    else {
      uVar1 = (segment->a).x;
      uVar2 = (segment->a).y;
      fVar4 = PVar6.z * fVar5 + (segment->a).z;
      local_28 = CONCAT31(local_28._1_3_,1);
      uStack_24 = CONCAT44((float)uVar2 + PVar6.y * fVar5,PVar6.x * fVar5 + (float)uVar1);
    }
  }
  else {
    local_28 = local_28 & 0xffffff00;
    uStack_24 = 0;
  }
  pVar3.second.x = (float)(undefined4)uStack_24;
  pVar3.second.y = (float)uStack_24._4_4_;
  pVar3._0_4_ = local_28;
  pVar3.second.z = fVar4;
  return pVar3;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Plane const& plane)
{
  Vector V = segment.b - segment.a;
  float x = dotProduct(V, plane.normal);
  if (x == 0)
    return {false, {}};

  float t = -(dotProduct(segment.a, plane.normal) + plane.d) / x;
  if (t < 0 || isCloseToZero(t))
    return {false, {}};

  return {true, segment.a + V * t};
}